

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O0

bool picojson::
     _parse_codepoint<std::__cxx11::string,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *out,
               input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *in)

{
  int iVar1;
  FILE *extraout_RDX;
  FILE *extraout_RDX_00;
  FILE *__stream;
  FILE *__stream_00;
  char cVar2;
  int local_24;
  int second;
  int uni_ch;
  input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *out_local;
  
  __stream_00 = (FILE *)in;
  local_24 = _parse_quadhex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                       ((picojson *)in,in);
  if (local_24 == -1) {
    return false;
  }
  if ((0xd7ff < local_24) && (local_24 < 0xe000)) {
    if (0xdbff < local_24) {
      return false;
    }
    iVar1 = input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::getc(in,__stream_00);
    __stream = extraout_RDX;
    if ((iVar1 != 0x5c) ||
       (iVar1 = input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::getc(in,__stream_00), __stream = extraout_RDX_00, iVar1 != 0x75)) {
      input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::ungetc(in,(int)__stream_00,__stream);
      return false;
    }
    iVar1 = _parse_quadhex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      ((picojson *)in,
                       (input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)__stream_00);
    if ((iVar1 < 0xdc00) || (0xdfff < iVar1)) {
      return false;
    }
    local_24 = ((local_24 + -0xd800) * 0x400 | iVar1 - 0xdc00U & 0x3ff) + 0x10000;
  }
  cVar2 = (char)out;
  if (local_24 < 0x80) {
    std::__cxx11::string::push_back(cVar2);
  }
  else {
    if (local_24 < 0x800) {
      std::__cxx11::string::push_back(cVar2);
    }
    else {
      if (local_24 < 0x10000) {
        std::__cxx11::string::push_back(cVar2);
      }
      else {
        std::__cxx11::string::push_back(cVar2);
        std::__cxx11::string::push_back(cVar2);
      }
      std::__cxx11::string::push_back(cVar2);
    }
    std::__cxx11::string::push_back(cVar2);
  }
  return true;
}

Assistant:

inline bool _parse_codepoint(String &out, input<Iter> &in) {
  int uni_ch;
  if ((uni_ch = _parse_quadhex(in)) == -1) {
    return false;
  }
  if (0xd800 <= uni_ch && uni_ch <= 0xdfff) {
    if (0xdc00 <= uni_ch) {
      // a second 16-bit of a surrogate pair appeared
      return false;
    }
    // first 16-bit of surrogate pair, get the next one
    if (in.getc() != '\\' || in.getc() != 'u') {
      in.ungetc();
      return false;
    }
    int second = _parse_quadhex(in);
    if (!(0xdc00 <= second && second <= 0xdfff)) {
      return false;
    }
    uni_ch = ((uni_ch - 0xd800) << 10) | ((second - 0xdc00) & 0x3ff);
    uni_ch += 0x10000;
  }
  if (uni_ch < 0x80) {
    out.push_back(static_cast<char>(uni_ch));
  } else {
    if (uni_ch < 0x800) {
      out.push_back(static_cast<char>(0xc0 | (uni_ch >> 6)));
    } else {
      if (uni_ch < 0x10000) {
        out.push_back(static_cast<char>(0xe0 | (uni_ch >> 12)));
      } else {
        out.push_back(static_cast<char>(0xf0 | (uni_ch >> 18)));
        out.push_back(static_cast<char>(0x80 | ((uni_ch >> 12) & 0x3f)));
      }
      out.push_back(static_cast<char>(0x80 | ((uni_ch >> 6) & 0x3f)));
    }
    out.push_back(static_cast<char>(0x80 | (uni_ch & 0x3f)));
  }
  return true;
}